

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O2

int __thiscall P2PFileReceiverConnection::OnFileDone(P2PFileReceiverConnection *this,TonkFile file)

{
  ostringstream *poVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  OutputWorker *pOVar4;
  int iVar5;
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  LogStringBuffer local_1a8;
  undefined1 auVar6 [16];
  
  if ((file->Flags & 2) == 0) {
    if ((int)Logger.ChannelMinLevel < 3) {
      auVar3 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,file->TotalBytes);
      uVar2 = file->ProgressBytes;
      poVar1 = &local_1a8.LogStream;
      local_1a8.ChannelName = Logger.ChannelName;
      local_1a8.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      auVar6._8_8_ = extraout_XMM1_Qb;
      auVar6._0_8_ = extraout_XMM1_Qa;
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"File(");
      std::operator<<((ostream *)poVar1,file->Name);
      std::operator<<((ostream *)poVar1,") progress: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," / ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," Bytes (");
      auVar6 = vcvtusi2ss_avx512f(auVar6,uVar2 * 100);
      std::ostream::operator<<((ostream *)poVar1,auVar6._0_4_ / auVar3._0_4_);
      std::operator<<((ostream *)poVar1,"%)");
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    if (file->OutputData == (uint8_t *)0x0) {
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = &local_1a8.LogStream;
        local_1a8.ChannelName = Logger.ChannelName;
        local_1a8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
        std::operator<<((ostream *)poVar1,"File transfer completed to disk: ");
        std::operator<<((ostream *)poVar1,file->OutputFileName);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      remove(file->Name);
      rename(file->OutputFileName,file->Name);
    }
    else if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = &local_1a8.LogStream;
      local_1a8.ChannelName = Logger.ChannelName;
      local_1a8.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Written to memory buffer: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," bytes");
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    iVar5 = 0;
    LOCK();
    (this->Receiver->Complete)._M_base._M_i = true;
    UNLOCK();
  }
  else {
    iVar5 = 1;
    if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = &local_1a8.LogStream;
      local_1a8.ChannelName = Logger.ChannelName;
      local_1a8.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"File transfer failed: ");
      std::operator<<((ostream *)poVar1,file->Name);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
  }
  return iVar5;
}

Assistant:

int P2PFileReceiverConnection::OnFileDone(TonkFile file)
{
    if (file->Flags & TonkFileFlags_Failed)
    {
        Logger.Error("File transfer failed: ", file->Name);
        return TONK_FILE_DELETE;
    }

    Logger.Info("File(", file->Name, ") progress: ", file->ProgressBytes, " / ", file->TotalBytes,
        " Bytes (", file->ProgressBytes * 100 / (float)file->TotalBytes, "%)");

    if (file->OutputData)
    {
        Logger.Info("Written to memory buffer: ", file->TotalBytes, " bytes");
    }
    else
    {
        Logger.Info("File transfer completed to disk: ", file->OutputFileName);

        // Delete any old file with the target name
        std::remove(file->Name);

        // Rename the output file to the target file name
        std::rename(file->OutputFileName, file->Name);
    }

    // Mark it as complete so the session ends
    Receiver->Complete = true;

    return TONK_FILE_KEEP;
}